

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_Constructor_type_Test::TestBody(AddressFactory_Constructor_type_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  char *pcVar7;
  CfdException *anon_var_0_3;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  AddressFactory factory_13;
  CfdException *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  AddressFactory factory_12;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  AddressFactory factory_11;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AddressFactory factory_10;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  Address address_2;
  AddressFactory factory_9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Address address_1;
  AddressFactory factory_8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  AddressFactory factory_7;
  Pubkey pubkey;
  AddressFactory factory_6;
  AddressFactory factory_5;
  AddressFactory factory_4;
  AddressFactory factory_3;
  AddressFactory factory_2;
  AddressFactory factory_1;
  AddressFactory factory;
  NetType in_stack_fffffffffffff0ac;
  undefined1 in_stack_fffffffffffff0b0;
  undefined1 in_stack_fffffffffffff0b1;
  undefined1 in_stack_fffffffffffff0b2;
  undefined1 in_stack_fffffffffffff0b3;
  undefined1 in_stack_fffffffffffff0b4;
  undefined1 in_stack_fffffffffffff0b5;
  undefined1 in_stack_fffffffffffff0b6;
  undefined1 in_stack_fffffffffffff0b7;
  AddressFactory *in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0c0;
  undefined4 in_stack_fffffffffffff0c4;
  char *in_stack_fffffffffffff0c8;
  AssertHelper local_ed8;
  Message local_ed0 [49];
  byte local_d41;
  ConstCharPtr local_d40 [6];
  AssertHelper local_d10;
  Message local_d08 [49];
  byte local_b79;
  ConstCharPtr local_b78 [6];
  AssertHelper local_b48;
  Message local_b40 [49];
  byte local_9b1;
  ConstCharPtr local_9b0 [6];
  AssertHelper local_980;
  Message local_978 [49];
  byte local_7e9;
  ConstCharPtr local_7e8 [6];
  AssertHelper local_7b8;
  Message local_7b0;
  undefined4 local_7a8;
  WitnessVersion local_7a4;
  AssertionResult local_7a0;
  AssertHelper local_790;
  Message local_788;
  undefined4 local_780;
  NetType local_77c;
  AssertionResult local_778;
  Address local_768;
  AssertHelper local_5c8;
  Message local_5c0;
  undefined4 local_5b8;
  WitnessVersion local_5b4;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  undefined4 local_590;
  NetType local_58c;
  AssertionResult local_588;
  Address local_578;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined4 local_3c8;
  WitnessVersion local_3c4;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined4 local_3a0;
  NetType local_39c;
  AssertionResult local_398;
  Address local_388;
  allocator local_1e1;
  string local_1e0;
  Pubkey local_1c0;
  AssertHelper local_1a8;
  Message local_1a0 [6];
  AssertHelper local_170;
  Message local_168 [6];
  AssertHelper local_138;
  Message local_130 [6];
  AssertHelper local_100;
  Message local_f8 [6];
  AssertHelper local_c8;
  Message local_c0 [6];
  AssertHelper local_90;
  Message local_88 [6];
  AssertHelper local_58;
  Message local_50 [10];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c262d);
    }
  }
  else {
    testing::Message::Message(local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2b,
               "Expected: AddressFactory factory(NetType::kMainnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x1c26d0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c275c);
    }
  }
  else {
    testing::Message::Message(local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2c,
               "Expected: AddressFactory factory(NetType::kTestnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x1c27ff);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c288b);
    }
  }
  else {
    testing::Message::Message(local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2d,
               "Expected: AddressFactory factory(NetType::kRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x1c292e);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c29ba);
    }
  }
  else {
    testing::Message::Message(local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2e,
               "Expected: AddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message((Message *)0x1c2a5d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c2ae9);
    }
  }
  else {
    testing::Message::Message(local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2f,
               "Expected: AddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_138,local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x1c2b8c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c2c18);
    }
  }
  else {
    testing::Message::Message(local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x30,
               "Expected: AddressFactory factory(NetType::kCustomChain) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x1c2cbb);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff0b7,
                          CONCAT16(in_stack_fffffffffffff0b6,
                                   CONCAT15(in_stack_fffffffffffff0b5,
                                            CONCAT14(in_stack_fffffffffffff0b4,
                                                     CONCAT13(in_stack_fffffffffffff0b3,
                                                              CONCAT12(in_stack_fffffffffffff0b2,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
                 in_stack_fffffffffffff0ac);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c2d47);
    }
  }
  else {
    testing::Message::Message(local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x31,
               "Expected: AddressFactory factory(NetType::kNetTypeNum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x1c2dea);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e0,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_1e1);
  cfd::core::Pubkey::Pubkey(&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  cfd::AddressFactory::CreateP2pkhAddress
            (in_stack_fffffffffffff0b8,
             (Pubkey *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  local_39c = cfd::core::Address::GetNetType(&local_388);
  local_3a0 = 0;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (NetType *)in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3a8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1c3007);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x38,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message((Message *)0x1c3064);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c30bc);
  local_3c4 = cfd::core::Address::GetWitnessVersion(&local_388);
  local_3c8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1c317b);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x39,pcVar7);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message((Message *)0x1c31d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c3230);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c324a);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  cfd::AddressFactory::CreateP2pkhAddress
            (in_stack_fffffffffffff0b8,
             (Pubkey *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  local_58c = cfd::core::Address::GetNetType(&local_578);
  local_590 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (NetType *)in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1c3388);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x3e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    testing::Message::~Message((Message *)0x1c33e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c343d);
  local_5b4 = cfd::core::Address::GetWitnessVersion(&local_578);
  local_5b8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x1c34fc);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x3f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    testing::Message::~Message((Message *)0x1c3559);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c35b1);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c35cb);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  cfd::AddressFactory::CreateP2pkhAddress
            (in_stack_fffffffffffff0b8,
             (Pubkey *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  local_77c = cfd::core::Address::GetNetType(&local_768);
  local_780 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            (in_stack_fffffffffffff0c8,
             (char *)CONCAT44(in_stack_fffffffffffff0c4,in_stack_fffffffffffff0c0),
             (NetType *)in_stack_fffffffffffff0b8,
             (NetType *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    in_stack_fffffffffffff0c8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1c3709);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x44,in_stack_fffffffffffff0c8);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message((Message *)0x1c3766);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c37be);
  local_7a4 = cfd::core::Address::GetWitnessVersion(&local_768);
  local_7a8 = 0xffffffff;
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            (in_stack_fffffffffffff0c8,(char *)CONCAT44(local_7a4,in_stack_fffffffffffff0c0),
             (WitnessVersion *)in_stack_fffffffffffff0b8,
             (WitnessVersion *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a0);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    in_stack_fffffffffffff0b8 =
         (AddressFactory *)testing::AssertionResult::failure_message((AssertionResult *)0x1c387d);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x45,(char *)in_stack_fffffffffffff0b8);
    testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    testing::Message::~Message((Message *)0x1c38da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c3932);
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c394c);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_fffffffffffff0b7,
                      CONCAT16(in_stack_fffffffffffff0b6,
                               CONCAT15(in_stack_fffffffffffff0b5,
                                        CONCAT14(in_stack_fffffffffffff0b4,
                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                          CONCAT12(in_stack_fffffffffffff0b2,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  testing::internal::ConstCharPtr::ConstCharPtr(local_7e8,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_7e8);
  if ((bool)uVar2) {
    local_7e9 = 0;
    in_stack_fffffffffffff0b6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b6) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff0b8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(in_stack_fffffffffffff0b5,
                                                  CONCAT14(in_stack_fffffffffffff0b4,
                                                           CONCAT13(in_stack_fffffffffffff0b3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(in_stack_fffffffffffff0b5,
                                                  CONCAT14(in_stack_fffffffffffff0b4,
                                                           CONCAT13(in_stack_fffffffffffff0b3,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_7e9 & 1) == 0) {
      local_7e8[0].value =
           "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001c3aca;
    }
  }
  else {
LAB_001c3aca:
    testing::Message::Message(local_978);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x49,local_7e8[0].value);
    testing::internal::AssertHelper::operator=(&local_980,local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message((Message *)0x1c3b32);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c3b8a);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                     CONCAT15(in_stack_fffffffffffff0b5,
                                              CONCAT14(in_stack_fffffffffffff0b4,
                                                       CONCAT13(in_stack_fffffffffffff0b3,
                                                                CONCAT12(in_stack_fffffffffffff0b2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff0b1,
                                                  in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  testing::internal::ConstCharPtr::ConstCharPtr(local_9b0,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_9b0);
  if ((bool)uVar3) {
    local_9b1 = 0;
    in_stack_fffffffffffff0b4 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b4) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff0b8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(in_stack_fffffffffffff0b3,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_9b1 & 1) == 0) {
      local_9b0[0].value =
           "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001c3cee;
    }
  }
  else {
LAB_001c3cee:
    testing::Message::Message(local_b40);
    testing::internal::AssertHelper::AssertHelper
              (&local_b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x4d,local_9b0[0].value);
    testing::internal::AssertHelper::operator=(&local_b48,local_b40);
    testing::internal::AssertHelper::~AssertHelper(&local_b48);
    testing::Message::~Message((Message *)0x1c3d56);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c3dae);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                     CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                             CONCAT13(in_stack_fffffffffffff0b3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  testing::internal::ConstCharPtr::ConstCharPtr(local_b78,"");
  uVar4 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_b78);
  if ((bool)uVar4) {
    local_b79 = 0;
    in_stack_fffffffffffff0b2 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff0b2) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff0b8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))));
    }
    if ((local_b79 & 1) == 0) {
      local_b78[0].value =
           "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001c3f12;
    }
  }
  else {
LAB_001c3f12:
    testing::Message::Message(local_d08);
    testing::internal::AssertHelper::AssertHelper
              (&local_d10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x51,local_b78[0].value);
    testing::internal::AssertHelper::operator=(&local_d10,local_d08);
    testing::internal::AssertHelper::~AssertHelper(&local_d10);
    testing::Message::~Message((Message *)0x1c3f7a);
  }
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c3fd2);
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                     CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                             CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,
                                                  CONCAT11(in_stack_fffffffffffff0b1,
                                                           in_stack_fffffffffffff0b0))))))),
             in_stack_fffffffffffff0ac);
  testing::internal::ConstCharPtr::ConstCharPtr(local_d40,"");
  uVar5 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_d40);
  if ((bool)uVar5) {
    local_d41 = 0;
    uVar6 = testing::internal::AlwaysTrue();
    if ((bool)uVar6) {
      cfd::AddressFactory::CreateP2pkhAddress
                (in_stack_fffffffffffff0b8,
                 (Pubkey *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,CONCAT11(uVar5,uVar6))))
                                                 ))));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff0b6,
                                         CONCAT15(uVar3,CONCAT14(in_stack_fffffffffffff0b4,
                                                                 CONCAT13(uVar4,CONCAT12(
                                                  in_stack_fffffffffffff0b2,CONCAT11(uVar5,uVar6))))
                                                 ))));
    }
    if ((local_d41 & 1) != 0) goto LAB_001c41e6;
    local_d40[0].value =
         "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_ed0);
  testing::internal::AssertHelper::AssertHelper
            (&local_ed8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
             ,0x55,local_d40[0].value);
  testing::internal::AssertHelper::operator=(&local_ed8,local_ed0);
  testing::internal::AssertHelper::~AssertHelper(&local_ed8);
  testing::Message::~Message((Message *)0x1c419e);
LAB_001c41e6:
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1c41f3);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1c4200);
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}